

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argon2-template-128.h
# Opt level: O3

void next_addresses(block *address_block,block *input_block)

{
  __m512i zero2_block [16];
  __m512i zero_block [16];
  longlong alStack_880 [128];
  longlong local_480 [139];
  
  memset((__m512i *)local_480,0,0x400);
  memset(alStack_880,0,0x400);
  input_block->v[6] = input_block->v[6] + 1;
  fill_block((__m512i *)local_480,input_block,address_block,0);
  fill_block((__m512i *)alStack_880,address_block,address_block,0);
  return;
}

Assistant:

static void next_addresses(block *address_block, block *input_block)
{
    /*Temporary zero-initialized blocks*/
    __m128i zero_block[ARGON2_OWORDS_IN_BLOCK];
    __m128i zero2_block[ARGON2_OWORDS_IN_BLOCK];

    memset(zero_block, 0, sizeof(zero_block));
    memset(zero2_block, 0, sizeof(zero2_block));

    /*Increasing index counter*/
    input_block->v[6]++;

    /*First iteration of G*/
    fill_block(zero_block, input_block, address_block, 0);

    /*Second iteration of G*/
    fill_block(zero2_block, address_block, address_block, 0);
}